

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

string * __thiscall
Al::build_string<std::__cxx11::string>
          (string *__return_storage_ptr__,Al *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string build_string(Args&&... args) {
  std::ostringstream oss;
  (oss << ... << args);
  return oss.str();
}